

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char*,char>>::operator()
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,double value)

{
  iterator pcVar1;
  long in_RDI;
  basic_format_specs<char> *in_XMM0_Qa;
  format_specs *in_stack_000002a0;
  double in_stack_000002a8;
  basic_writer<fmt::v5::output_range<char_*,_char>_> *in_stack_000002b0;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    basic_format_specs<char>::basic_format_specs(in_XMM0_Qa);
  }
  basic_writer<fmt::v5::output_range<char_*,_char>_>::write_double<double>
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0);
  pcVar1 = arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::out
                     ((arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *)0x1ef8e6);
  return pcVar1;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }